

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

void __thiscall
miniros::Publication::addCallbacks(Publication *this,SubscriberCallbacksPtr *callbacks)

{
  element_type *peVar1;
  pointer psVar2;
  CallbackQueueInterface *pCVar3;
  pointer __args_2;
  undefined1 local_58 [16];
  _Manager_type local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  std::mutex::lock(&this->callbacks_mutex_);
  std::
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  ::push_back(&this->callbacks_,callbacks);
  peVar1 = (callbacks->super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (((peVar1->connect_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (peVar1->callback_queue_ != (CallbackQueueInterface *)0x0)) {
    std::mutex::lock(&this->subscriber_links_mutex_);
    psVar2 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args_2 = (this->subscriber_links_).
                    super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args_2 != psVar2;
        __args_2 = __args_2 + 1) {
      peVar1 = (callbacks->
               super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::
      make_shared<miniros::PeerConnDisconnCallback,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<miniros::SubscriberLink>const&,bool&,std::weak_ptr<void_const>&>
                ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)local_58,
                 (shared_ptr<miniros::SubscriberLink> *)peVar1,(bool *)__args_2,
                 (weak_ptr<const_void> *)&peVar1->has_tracked_object_);
      local_48 = (_Manager_type)local_58._0_8_;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_;
      local_58._0_8_ = (void *)0x0;
      local_58._8_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      pCVar3 = ((callbacks->
                super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->callback_queue_;
      (*pCVar3->_vptr_CallbackQueueInterface[2])(pCVar3,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->subscriber_links_mutex_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->callbacks_mutex_);
  return;
}

Assistant:

void Publication::addCallbacks(const SubscriberCallbacksPtr& callbacks)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  callbacks_.push_back(callbacks);

  // Add connect callbacks for all current subscriptions if this publisher wants them
  if (callbacks->connect_ && callbacks->callback_queue_)
  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);
    V_SubscriberLink::iterator it = subscriber_links_.begin();
    V_SubscriberLink::iterator end = subscriber_links_.end();
    for (; it != end; ++it)
    {
      const SubscriberLinkPtr& sub_link = *it;
      CallbackInterfacePtr cb(std::make_shared<PeerConnDisconnCallback>(callbacks->connect_, sub_link, callbacks->has_tracked_object_, callbacks->tracked_object_));
      callbacks->callback_queue_->addCallback(cb, (uint64_t)callbacks.get());
    }
  }
}